

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

void quantize_row_q5_1_ref(float *x,block_q5_1 *y,int64_t k)

{
  ggml_fp16_t gVar1;
  int j_1;
  ulong uVar2;
  ulong uVar3;
  int j;
  long lVar4;
  uint uVar5;
  uint8_t *puVar6;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float f;
  
  uVar9 = 0;
  uVar2 = k / 0x20 & 0xffffffff;
  if ((int)(k / 0x20) < 1) {
    uVar2 = uVar9;
  }
  puVar6 = y->qs;
  for (; uVar9 != uVar2; uVar9 = uVar9 + 1) {
    uVar3 = (ulong)((uint)uVar9 & 0x7ffffff);
    fVar10 = -3.4028235e+38;
    f = 3.4028235e+38;
    for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 1) {
      fVar12 = x[uVar3 * 0x20 + lVar4];
      fVar11 = fVar12;
      if (f <= fVar12) {
        fVar11 = f;
      }
      if (fVar12 <= fVar10) {
        fVar12 = fVar10;
      }
      fVar10 = fVar12;
      f = fVar11;
    }
    fVar10 = (fVar10 - f) / 31.0;
    fVar12 = (float)(-(uint)(fVar10 != 0.0) & (uint)(1.0 / fVar10));
    gVar1 = ggml_compute_fp32_to_fp16(fVar10);
    y[uVar9].field_0.field_0.d = gVar1;
    gVar1 = ggml_compute_fp32_to_fp16(f);
    y[uVar9].field_0.field_0.m = gVar1;
    uVar5 = 0;
    for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
      bVar7 = (byte)(int)((x[uVar3 * 0x20 + lVar4] - f) * fVar12 + 0.5);
      bVar8 = (byte)(int)((x[uVar3 * 0x20 + lVar4 + 0x10] - f) * fVar12 + 0.5);
      puVar6[lVar4] = bVar8 << 4 | bVar7 & 0xf;
      uVar5 = uVar5 | (uint)(bVar8 >> 4 & 1) << ((byte)lVar4 & 0x1f | 0x10) |
                      (uint)(bVar7 >> 4 & 1) << ((byte)lVar4 & 0x1f);
    }
    *(uint *)y[uVar9].qh = uVar5;
    puVar6 = puVar6 + 0x18;
  }
  return;
}

Assistant:

void quantize_row_q5_1_ref(const float * GGML_RESTRICT x, block_q5_1 * GGML_RESTRICT y, int64_t k) {
    const int qk = QK5_1;

    assert(k % qk == 0);

    const int nb = k / qk;

    for (int i = 0; i < nb; i++) {
        float min = FLT_MAX;
        float max = -FLT_MAX;

        for (int j = 0; j < qk; j++) {
            const float v = x[i*qk + j];

            if (v < min) min = v;
            if (v > max) max = v;
        }

        const float d  = (max - min) / ((1 << 5) - 1);
        const float id = d ? 1.0f/d : 0.0f;

        y[i].d = GGML_FP32_TO_FP16(d);
        y[i].m = GGML_FP32_TO_FP16(min);

        uint32_t qh = 0;

        for (int j = 0; j < qk/2; ++j) {
            const float x0 = (x[i*qk + 0    + j] - min)*id;
            const float x1 = (x[i*qk + qk/2 + j] - min)*id;

            const uint8_t xi0 = (uint8_t)(x0 + 0.5f);
            const uint8_t xi1 = (uint8_t)(x1 + 0.5f);

            y[i].qs[j] = (xi0 & 0x0F) | ((xi1 & 0x0F) << 4);

            // get the 5-th bit and store it in qh at the right position
            qh |= ((xi0 & 0x10u) >> 4) << (j + 0);
            qh |= ((xi1 & 0x10u) >> 4) << (j + qk/2);
        }

        memcpy(&y[i].qh, &qh, sizeof(y[i].qh));
    }
}